

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O2

void yin_print_extcomplex_flags
               (lyout *out,int level,lys_module *module,lys_ext_instance_complex *ext,LY_STMT stmt,
               char *val1_str,char *val2_str,uint16_t val1,uint16_t val2,int *content)

{
  int iVar1;
  ushort *puVar2;
  char *text;
  
  puVar2 = (ushort *)lys_ext_complex_get_substmt(stmt,ext,(lyext_substmt **)0x0);
  if ((puVar2 != (ushort *)0x0) &&
     (((text = val1_str, (val1 & *puVar2) != 0 || (text = val2_str, (val2 & *puVar2) != 0)) ||
      (iVar1 = lys_ext_iter(ext->ext,ext->ext_size,'\0',stmt), text = val1_str, iVar1 != -1)))) {
    yin_print_close_parent(out,content);
    yin_print_substmt(out,level,stmt,'\0',text,module,ext->ext,(uint)ext->ext_size);
  }
  return;
}

Assistant:

static void
yin_print_extcomplex_flags(struct lyout *out, int level, const struct lys_module *module,
                           struct lys_ext_instance_complex *ext, LY_STMT stmt,
                           const char *val1_str, const char *val2_str, uint16_t val1, uint16_t val2,
                           int *content)
{
    const char *str;
    uint16_t *flags;

    flags = lys_ext_complex_get_substmt(stmt, ext, NULL);
    if (!flags) {
        return;
    }

    if (val1 & *flags) {
        str = val1_str;
    } else if (val2 & *flags) {
        str = val2_str;
    } else if (lys_ext_iter(ext->ext, ext->ext_size, 0, (LYEXT_SUBSTMT)stmt) != -1) {
        /* flag not set, but since there are some extension, we are going to print the default value */
        str = val1_str;
    } else {
        return;
    }

    yin_print_close_parent(out, content);
    yin_print_substmt(out, level, (LYEXT_SUBSTMT)stmt, 0, str, module, ext->ext, ext->ext_size);
}